

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall
pybind11::detail::error_fetch_and_normalize::restore(error_fetch_and_normalize *this)

{
  PyObject *pPVar1;
  PyObject *pPVar2;
  handle *phVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (this->m_restore_called != true) {
    phVar3 = handle::inc_ref((handle *)this);
    pPVar1 = phVar3->m_ptr;
    phVar3 = handle::inc_ref(&(this->m_value).super_handle);
    pPVar2 = phVar3->m_ptr;
    phVar3 = handle::inc_ref(&(this->m_trace).super_handle);
    PyErr_Restore(pPVar1,pPVar2,phVar3->m_ptr);
    this->m_restore_called = true;
    return;
  }
  __rhs = error_string_abi_cxx11_(this);
  std::operator+(&bStack_38,
                 "Internal error: pybind11::detail::error_fetch_and_normalize::restore() called a second time. ORIGINAL ERROR: "
                 ,__rhs);
  pybind11_fail(&bStack_38);
}

Assistant:

void restore() {
        if (m_restore_called) {
            pybind11_fail("Internal error: pybind11::detail::error_fetch_and_normalize::restore() "
                          "called a second time. ORIGINAL ERROR: "
                          + error_string());
        }
        PyErr_Restore(m_type.inc_ref().ptr(), m_value.inc_ref().ptr(), m_trace.inc_ref().ptr());
        m_restore_called = true;
    }